

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<kj::Array<unsigned_char>_> __thiscall
kj::AsyncInputStream::readAllBytes(AsyncInputStream *this,uint64_t limit)

{
  PromiseArena *pPVar1;
  AsyncInputStream AVar2;
  void *pvVar3;
  AllReader *ptrCopy;
  SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:161:29)>
  *location;
  Promise<kj::Array<unsigned_char>_> promise;
  void *continuationTracePtr;
  Own<kj::(anonymous_namespace)::AllReader,_std::nullptr_t> reader;
  undefined1 local_70 [8];
  AsyncInputStream local_68;
  Own<kj::(anonymous_namespace)::AllReader,_std::nullptr_t> local_60;
  OwnPromiseNode local_50;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_48;
  RemoveConst<kj::Array<unsigned_char>_> *local_40;
  AllReader *local_38;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_30;
  
  heap<kj::(anonymous_namespace)::AllReader,kj::AsyncInputStream&>
            ((kj *)&local_40,(AsyncInputStream *)limit);
  anon_unknown_123::AllReader::loop((AllReader *)local_70,(uint64_t)local_38);
  local_60.disposer = (Disposer *)local_38;
  local_48.ptr = (PromiseNode *)
                 kj::_::
                 SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:161:29)>
                 ::anon_class_16_2_f81c8ca8_for_func::operator();
  pPVar1 = ((PromiseArenaMember *)local_70)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_70 - (long)pPVar1) < 0x30) {
    pvVar3 = operator_new(0x400);
    location = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:161:29)>
                *)((long)pvVar3 + 0x3d0);
    ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::AllReader::readAllBytes(unsigned_long)::_lambda(unsigned_long)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AllReader::readAllBytes(unsigned_long)::_lambda(unsigned_long)_1_,void*&>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_70,
               (anon_class_16_2_f81c8ca8_for_func *)&local_60,&local_48.ptr);
    *(void **)((long)pvVar3 + 0x3d8) = pvVar3;
  }
  else {
    ((PromiseArenaMember *)local_70)->arena = (PromiseArena *)0x0;
    location = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:161:29)>
                *)((long)local_70 + -0x30);
    ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::AllReader::readAllBytes(unsigned_long)::_lambda(unsigned_long)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AllReader::readAllBytes(unsigned_long)::_lambda(unsigned_long)_1_,void*&>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_70,
               (anon_class_16_2_f81c8ca8_for_func *)&local_60,&local_48.ptr);
    (((PromiseNode *)((long)local_70 + -0x30))->super_PromiseArenaMember).arena = pPVar1;
  }
  local_68._vptr_AsyncInputStream = (_func_int **)0x0;
  local_30.ptr = (PromiseNode *)0x0;
  local_50.ptr = (PromiseNode *)location;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_30);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_68);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_70);
  local_60.disposer = (Disposer *)local_40;
  local_60.ptr = local_38;
  local_38 = (AllReader *)0x0;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AllReader,decltype(nullptr)>>,kj::_::PromiseDisposer,kj::Own<kj::(anonymous_namespace)::AllReader,decltype(nullptr)>>
            ((PromiseDisposer *)&local_68,&local_50,&local_60);
  AVar2._vptr_AsyncInputStream = local_68._vptr_AsyncInputStream;
  local_68._vptr_AsyncInputStream = (_func_int **)0x0;
  this->_vptr_AsyncInputStream = (_func_int **)AVar2;
  local_48.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_48);
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AllReader,_std::nullptr_t>_>,_kj::_::PromiseDisposer>
  ::~Own((Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AllReader,_std::nullptr_t>_>,_kj::_::PromiseDisposer>
          *)&local_68);
  if (local_60.ptr != (AllReader *)0x0) {
    (**(local_60.disposer)->_vptr_Disposer)();
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_50);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<Array<byte>> AsyncInputStream::readAllBytes(uint64_t limit) {
  auto reader = kj::heap<AllReader>(*this);
  auto promise = reader->readAllBytes(limit);
  return promise.attach(kj::mv(reader));
}